

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_cookie_cleanup(CookieInfo *c)

{
  long lVar1;
  
  if (c != (CookieInfo *)0x0) {
    (*Curl_cfree)(c->filename);
    for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
      Curl_cookie_freelist(c->cookies[lVar1]);
    }
    (*Curl_cfree)(c);
    return;
  }
  return;
}

Assistant:

void Curl_cookie_cleanup(struct CookieInfo *c)
{
  if(c) {
    unsigned int i;
    free(c->filename);
    for(i = 0; i < COOKIE_HASH_SIZE; i++)
      Curl_cookie_freelist(c->cookies[i]);
    free(c); /* free the base struct as well */
  }
}